

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base58.cpp
# Opt level: O2

bool DecodeBase58(char *psz,vector<unsigned_char,_std::allocator<unsigned_char>_> *vch,
                 int max_ret_len)

{
  byte bVar1;
  long lVar2;
  undefined1 auVar3 [16];
  int iVar4;
  int iVar5;
  ulong uVar6;
  size_t sVar7;
  pointer puVar8;
  int iVar9;
  uint uVar10;
  bool bVar11;
  uint uVar12;
  byte *pbVar13;
  size_type __n;
  char *pcVar14;
  byte *pbVar15;
  value_type_conflict *__x;
  long in_FS_OFFSET;
  allocator_type local_51;
  vector<unsigned_char,_std::allocator<unsigned_char>_> b256;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar14 = psz + 1;
  while ((uVar6 = (ulong)(byte)pcVar14[-1], uVar6 < 0x21 &&
         ((0x100003e00U >> (uVar6 & 0x3f) & 1) != 0))) {
    pcVar14 = pcVar14 + 1;
  }
  iVar9 = 0;
  iVar4 = 0;
  if (0 < max_ret_len) {
    iVar4 = max_ret_len;
  }
  __n = 0;
  while ((char)uVar6 == '1') {
    if (iVar4 == (int)__n) {
      bVar11 = false;
      goto LAB_0035c124;
    }
    pbVar13 = (byte *)(pcVar14 + __n);
    __n = __n + 1;
    iVar9 = iVar9 + -1;
    uVar6 = (ulong)*pbVar13;
  }
  pbVar13 = (byte *)(pcVar14 + (__n - 1));
  pbVar15 = (byte *)(pcVar14 + __n);
  sVar7 = strlen((char *)pbVar13);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = sVar7 * 0x2dd;
  iVar4 = SUB164(auVar3 / ZEXT816(1000),0) + 1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&b256,(long)iVar4,&local_51);
  uVar10 = 0;
  do {
    uVar6 = (ulong)*pbVar13;
    if ((uVar6 < 0x21) && ((0x100003e01U >> (uVar6 & 0x3f) & 1) != 0)) goto LAB_0035c09a;
    iVar5 = (int)mapBase58[uVar6];
    uVar12 = 0;
    puVar8 = b256.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (iVar5 == -1) goto LAB_0035c11a;
    for (; uVar12 < uVar10 || iVar5 != 0; uVar12 = uVar12 + 1) {
      if (puVar8 == b256.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start) {
        if (iVar5 != 0) {
          __assert_fail("carry == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/base58.cpp"
                        ,0x45,"bool DecodeBase58(const char *, std::vector<unsigned char> &, int)");
        }
        break;
      }
      iVar5 = (uint)puVar8[-1] * 0x3a + iVar5;
      puVar8[-1] = (uchar)iVar5;
      iVar5 = iVar5 / 0x100;
      puVar8 = puVar8 + -1;
    }
    pbVar13 = pbVar13 + 1;
    pbVar15 = pbVar15 + 1;
    uVar10 = uVar12;
  } while ((int)(uVar12 - iVar9) <= max_ret_len);
LAB_0035c112:
  uVar12 = 0;
LAB_0035c11a:
  bVar11 = SUB41(uVar12,0);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&b256.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
LAB_0035c124:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return bVar11;
LAB_0035c09a:
  while ((iVar9 = (int)uVar6, iVar9 - 9U < 5 || (iVar9 == 0x20))) {
    bVar1 = *pbVar15;
    pbVar15 = pbVar15 + 1;
    uVar6 = (ulong)bVar1;
  }
  if (iVar9 == 0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
              (vch,(size_type)
                   (b256.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish +
                   uVar10 + __n +
                   (-(long)iVar4 -
                   (long)b256.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start)));
    local_51 = (allocator_type)0x0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_fill_assign
              (vch,__n,(value_type_conflict *)&local_51);
    for (__x = b256.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start + (int)(iVar4 - uVar10);
        __x != b256.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish; __x = __x + 1) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(vch,__x);
    }
    uVar12 = 1;
    goto LAB_0035c11a;
  }
  goto LAB_0035c112;
}

Assistant:

[[nodiscard]] static bool DecodeBase58(const char* psz, std::vector<unsigned char>& vch, int max_ret_len)
{
    // Skip leading spaces.
    while (*psz && IsSpace(*psz))
        psz++;
    // Skip and count leading '1's.
    int zeroes = 0;
    int length = 0;
    while (*psz == '1') {
        zeroes++;
        if (zeroes > max_ret_len) return false;
        psz++;
    }
    // Allocate enough space in big-endian base256 representation.
    int size = strlen(psz) * 733 /1000 + 1; // log(58) / log(256), rounded up.
    std::vector<unsigned char> b256(size);
    // Process the characters.
    static_assert(std::size(mapBase58) == 256, "mapBase58.size() should be 256"); // guarantee not out of range
    while (*psz && !IsSpace(*psz)) {
        // Decode base58 character
        int carry = mapBase58[(uint8_t)*psz];
        if (carry == -1)  // Invalid b58 character
            return false;
        int i = 0;
        for (std::vector<unsigned char>::reverse_iterator it = b256.rbegin(); (carry != 0 || i < length) && (it != b256.rend()); ++it, ++i) {
            carry += 58 * (*it);
            *it = carry % 256;
            carry /= 256;
        }
        assert(carry == 0);
        length = i;
        if (length + zeroes > max_ret_len) return false;
        psz++;
    }
    // Skip trailing spaces.
    while (IsSpace(*psz))
        psz++;
    if (*psz != 0)
        return false;
    // Skip leading zeroes in b256.
    std::vector<unsigned char>::iterator it = b256.begin() + (size - length);
    // Copy result into output vector.
    vch.reserve(zeroes + (b256.end() - it));
    vch.assign(zeroes, 0x00);
    while (it != b256.end())
        vch.push_back(*(it++));
    return true;
}